

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateCEnum
               (EnumDescriptor *desc,Printer *printer)

{
  char *pcVar1;
  EnumValueDescriptor *pEVar2;
  FileDescriptor *file;
  lts_20250127 *this;
  int i;
  int index;
  size_type in_R9;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view s;
  string_view s_00;
  FixedMapping replacements;
  FixedMapping replacements_00;
  string local_d8;
  string c_name;
  undefined1 local_98 [24];
  HeapOrSoo HStack_80;
  string php_name;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_50;
  
  pcVar1 = (desc->all_names_).payload_;
  this = (lts_20250127 *)(ulong)*(ushort *)(pcVar1 + 2);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)local_98,(char (*) [2])0x1096008,(char (*) [2])0xd6323e);
  s._M_str = (char *)local_98;
  s._M_len = (size_t)(pcVar1 + ~(ulong)this);
  replacements._M_len = in_R9;
  replacements._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_(&c_name,this,s,replacements);
  local_98._16_8_ = 0;
  HStack_80.heap.slot_array = (MaybeInitializedPtr)0x0;
  local_98._0_8_ = (pointer)0x0;
  local_98._8_8_ = (char *)0x0;
  HStack_80.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  FullClassName<google::protobuf::EnumDescriptor>(&local_d8,desc,(Options *)local_98);
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[3],_true>
            (&local_50,(char (*) [2])0x1133060,(char (*) [3])"\\\\");
  s_00._M_str = (char *)&local_50;
  s_00._M_len = (size_t)local_d8._M_dataplus._M_p;
  replacements_00._M_len = in_R9;
  replacements_00._M_array = (iterator)0x1;
  absl::lts_20250127::StrReplaceAll_abi_cxx11_
            (&php_name,(lts_20250127 *)local_d8._M_string_length,s_00,replacements_00);
  std::__cxx11::string::~string((string *)&local_d8);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(local_98 + 8));
  pcVar1 = (desc->all_names_).payload_;
  local_d8._M_dataplus._M_p = (pointer)(ulong)*(ushort *)(pcVar1 + 2);
  local_d8._M_string_length = (size_type)(pcVar1 + ~(ulong)local_d8._M_dataplus._M_p);
  php::(anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_98,(_anonymous_namespace_ *)desc->file_,file);
  text._M_str = 
  "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nPHP_METHOD($c_name$, name) {\n  $file_c_name$_AddDescriptor();\n  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, \"$name$\");\n  zend_long value;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n      FAILURE) {\n    return;\n  }\n  const upb_EnumValueDef* ev =\n      upb_EnumDef_FindValueByNumber(e, value);\n  if (!ev) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no name \"\n                            \"defined for value \" ZEND_LONG_FMT \".\",\n                            value);\n    return;\n  }\n  RETURN_STRING(upb_EnumValueDef_Name(ev));\n}\n\nPHP_METHOD($c_name$, value) {\n  $file_c_name$_AddDescriptor();\n  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, \"$name$\");\n  char *name = NULL;\n  size_t name_len;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n                            &name_len) == FAILURE) {\n    return;\n  }\n  const upb_EnumValueDef* ev = upb_EnumDef_FindValueByNameWithSize(\n      e, name, name_len);\n  if (!ev) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no value \"\n                            \"defined for name %s.\",\n                            name);\n    return;\n  }\n  RETURN_LONG(upb_EnumValueDef_Number(ev));\n}\n\nstatic zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
  ;
  text._M_len = 0x734;
  io::Printer::
  Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[12],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (printer,text,(char (*) [5])0xd8d1e3,
             (basic_string_view<char,_std::char_traits<char>_> *)&local_d8,
             (char (*) [12])"file_c_name",(string *)local_98,(char (*) [7])0xff9813,&c_name,
             (char (*) [9])"php_name",&php_name);
  std::__cxx11::string::~string((string *)local_98);
  for (index = 0; index < desc->value_count_; index = index + 1) {
    pEVar2 = EnumDescriptor::value(desc,index);
    local_d8._M_string_length = (size_type)(pEVar2->all_names_->_M_dataplus)._M_p;
    local_d8._M_dataplus._M_p = (pointer)pEVar2->all_names_->_M_string_length;
    std::__cxx11::to_string((string *)local_98,pEVar2->number_);
    text_00._M_str =
         "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n                                   strlen(\"$name$\"), $num$);\n"
    ;
    text_00._M_len = 0x77;
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::basic_string_view<char,std::char_traits<char>>,char[4],std::__cxx11::string>
              (printer,text_00,(char (*) [7])0xff9813,&c_name,(char (*) [5])0xd8d1e3,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_d8,(char (*) [4])0xe46f5d,
               (string *)local_98);
    std::__cxx11::string::~string((string *)local_98);
  }
  text_01._M_str = "}\n\n";
  text_01._M_len = 3;
  io::Printer::Print<>(printer,text_01);
  std::__cxx11::string::~string((string *)&php_name);
  std::__cxx11::string::~string((string *)&c_name);
  return;
}

Assistant:

void GenerateCEnum(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = absl::StrReplaceAll(desc->full_name(), {{".", "_"}});
  std::string php_name =
      absl::StrReplaceAll(FullClassName(desc, Options()), {{"\\", "\\\\"}});
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "PHP_METHOD($c_name$, name) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, "
      "\"$name$\");\n"
      "  zend_long value;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n"
      "      FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  const upb_EnumValueDef* ev =\n"
      "      upb_EnumDef_FindValueByNumber(e, value);\n"
      "  if (!ev) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no name \"\n"
      "                            \"defined for value \" ZEND_LONG_FMT "
      "\".\",\n"
      "                            value);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_STRING(upb_EnumValueDef_Name(ev));\n"
      "}\n"
      "\n"
      "PHP_METHOD($c_name$, value) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_DefPool *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_EnumDef *e = upb_DefPool_FindEnumByName(symtab, "
      "\"$name$\");\n"
      "  char *name = NULL;\n"
      "  size_t name_len;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n"
      "                            &name_len) == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  const upb_EnumValueDef* ev = upb_EnumDef_FindValueByNameWithSize(\n"
      "      e, name, name_len);\n"
      "  if (!ev) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no value \"\n"
      "                            \"defined for name %s.\",\n"
      "                            name);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_LONG(upb_EnumValueDef_Number(ev));\n"
      "}\n"
      "\n"
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | "
      "ZEND_ACC_STATIC)\n"
      "  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | "
      "ZEND_ACC_STATIC)\n"
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n",
      "name", desc->full_name(), "file_c_name", FilenameCName(desc->file()),
      "c_name", c_name, "php_name", php_name);

  for (int i = 0; i < desc->value_count(); i++) {
    const EnumValueDescriptor* value = desc->value(i);
    printer->Print(
        "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n"
        "                                   strlen(\"$name$\"), $num$);\n",
        "c_name", c_name, "name", value->name(), "num",
        std::to_string(value->number()));
  }

  printer->Print(
      "}\n"
      "\n");
}